

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall
bsplib::Rdma::put(Rdma *this,void *src,int dst_pid,Memslot dst_slot,size_t dst_offset,size_t size)

{
  int __flags;
  A2A *a2a;
  
  __flags = (int)dst_offset;
  if (((this->m_used_slots).
       super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
       super__Vector_impl_data._M_start[(long)this->m_nprocs * dst_slot + (long)this->m_pid].status
      & 1) == 0) {
    a2a = &this->m_second_exchange;
    serial<unsigned_long>(a2a,dst_pid,size);
    serial<unsigned_long>(a2a,dst_pid,dst_slot);
    serial<unsigned_long>(a2a,dst_pid,dst_offset);
    A2A::send(a2a,dst_pid,src,size,__flags);
    return;
  }
  __assert_fail("! (slot( m_pid, dst_slot ).status & Memblock::PUSHED)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                ,0x50,"void bsplib::Rdma::put(const void *, int, Memslot, size_t, size_t)");
}

Assistant:

void Rdma::put( const void * src,
        int dst_pid, Memslot dst_slot, size_t dst_offset, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::PUT );
    size_t t_a = m_second_exchange.send_size(dst_pid);
#endif

    assert( ! (slot( m_pid, dst_slot ).status & Memblock::PUSHED) );

    serial( m_second_exchange, dst_pid, size );
    serial( m_second_exchange, dst_pid, dst_slot );
    serial( m_second_exchange, dst_pid, dst_offset );

    m_second_exchange.send( dst_pid, src, size );
#ifdef PROFILE
    size_t t_b = m_second_exchange.send_size(dst_pid);
    t.add_bytes(t_b-t_a);
#endif
}